

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  uint uVar41;
  short sVar42;
  short sVar43;
  __m256i vWH_00;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  long lVar65;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  long in_stack_00000008;
  int32_t k;
  int16_t *j_1;
  int16_t *i_1;
  int16_t *u;
  int16_t *t;
  int16_t *s;
  int16_t last_val;
  int16_t max_col;
  int16_t max_row;
  __m256i cond_all_col;
  __m256i cond_all_row;
  __m256i cond_last_val;
  __m256i cond_max_col;
  __m256i cond_max_row;
  __m256i cond_i;
  __m256i cond_j;
  __m256i vJltLimit;
  __m256i vJgtNegOne;
  __m256i vJeqLimit1;
  __m256i cond;
  __m256i vNWH;
  __m256i vMat;
  __m256i vIeqLimit1;
  __m256i vIltLimit;
  int *matrow15;
  int *matrow14;
  int *matrow13;
  int *matrow12;
  int *matrow11;
  int *matrow10;
  int *matrow9;
  int *matrow8;
  int *matrow7;
  int *matrow6;
  int *matrow5;
  int *matrow4;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vJ;
  __m256i vF;
  __m256i vE;
  __m256i vWH;
  __m256i vNH;
  __m256i vIBoundary;
  __m256i vJLimit1;
  __m256i vJLimit;
  __m256i vILimit1;
  __m256i vILimit;
  __m256i vEndJ;
  __m256i vEndI;
  __m256i vLastVal;
  __m256i vMaxHCol;
  __m256i vMaxHRow;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vGapN;
  __m256i vN;
  __m256i vOne;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int16_t *F_pr;
  int16_t *H_pr;
  int16_t *s2;
  int16_t *_F_pr;
  int16_t *_H_pr;
  int16_t *s2B;
  int16_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int32_t in_stack_ffffffffffffe588;
  int32_t in_stack_ffffffffffffe58c;
  undefined4 in_stack_ffffffffffffe5a0;
  undefined4 in_stack_ffffffffffffe5b0;
  short local_1a44;
  int *array;
  int local_1a08;
  int local_1a04;
  int local_19f0;
  int local_19ec;
  int local_19d8;
  int local_19d4;
  int local_19c0;
  int local_19bc;
  int local_19a8;
  int local_19a4;
  int local_1990;
  int local_198c;
  int local_1978;
  int local_1974;
  int local_1960;
  int local_195c;
  int local_1948;
  int local_1944;
  int local_1930;
  int local_192c;
  int local_1918;
  int local_1914;
  int local_1900;
  int local_18fc;
  int local_18e8;
  int local_18e4;
  int local_18d0;
  int local_18cc;
  int local_18b8;
  int local_18b4;
  int local_18a0;
  int local_189c;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  uint local_17d8;
  int local_17d4;
  short *local_17d0;
  short *local_17c8;
  ushort *local_17c0;
  ushort *local_17b8;
  ushort *local_17b0;
  ushort local_17a6;
  ushort local_17a4;
  ushort local_17a2;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined1 local_1540 [32];
  undefined1 local_1520 [24];
  undefined8 uStack_1508;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [24];
  undefined8 uStack_14c8;
  undefined1 local_14c0 [24];
  undefined8 uStack_14a8;
  undefined1 local_14a0 [32];
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [16];
  undefined1 auStack_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 auStack_12d0 [16];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  ushort local_11be;
  ushort local_11bc;
  ushort local_11ba;
  int local_11b8;
  int local_11b4;
  uint local_11b0;
  uint local_11ac;
  parasail_result_t *local_11a8;
  int16_t *local_11a0;
  int16_t *local_1198;
  int16_t *local_1190;
  int16_t *local_1188;
  int16_t *local_1180;
  int16_t *local_1178;
  int16_t *local_1170;
  int local_1164;
  int local_1160;
  uint local_115c;
  int local_1158;
  int local_1154;
  int local_1150;
  uint local_114c;
  uint local_1148;
  uint local_1144;
  long local_1140;
  long local_1130;
  parasail_result_t *local_1128;
  undefined2 local_111a;
  ushort local_1118;
  ushort local_1116;
  undefined2 local_1114;
  ushort local_1112;
  undefined2 local_1110;
  undefined2 local_110e;
  undefined2 local_110c;
  ushort local_110a;
  ushort local_1108;
  ushort local_1106;
  ushort local_1104;
  ushort local_1102;
  undefined1 local_1100 [16];
  undefined1 auStack_10f0 [16];
  ushort local_10e0;
  ushort local_10de;
  ushort local_10dc;
  ushort local_10da;
  ushort local_10d8;
  ushort local_10d6;
  ushort local_10d4;
  ushort local_10d2;
  ushort local_10d0;
  ushort local_10ce;
  ushort local_10cc;
  ushort local_10ca;
  ushort local_10c8;
  ushort local_10c6;
  ushort local_10c4;
  ushort local_10c2;
  undefined1 local_10c0 [16];
  undefined1 auStack_10b0 [16];
  ushort local_10a0;
  ushort local_109e;
  ushort local_109c;
  ushort local_109a;
  ushort local_1098;
  ushort local_1096;
  ushort local_1094;
  ushort local_1092;
  ushort local_1090;
  ushort local_108e;
  ushort local_108c;
  ushort local_108a;
  ushort local_1088;
  ushort local_1086;
  ushort local_1084;
  ushort local_1082;
  undefined1 local_1080 [16];
  undefined1 auStack_1070 [16];
  ushort local_1060;
  ushort local_105e;
  ushort local_105c;
  ushort local_105a;
  ushort local_1058;
  ushort local_1056;
  ushort local_1054;
  ushort local_1052;
  ushort local_1050;
  ushort local_104e;
  ushort local_104c;
  ushort local_104a;
  ushort local_1048;
  ushort local_1046;
  ushort local_1044;
  ushort local_1042;
  undefined1 local_1040 [16];
  undefined1 auStack_1030 [16];
  ushort local_1020;
  ushort local_101e;
  ushort local_101c;
  ushort local_101a;
  ushort local_1018;
  ushort local_1016;
  ushort local_1014;
  ushort local_1012;
  ushort local_1010;
  ushort local_100e;
  ushort local_100c;
  ushort local_100a;
  ushort local_1008;
  ushort local_1006;
  ushort local_1004;
  ushort local_1002;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  ushort local_fe0;
  ushort local_fde;
  ushort local_fdc;
  ushort local_fda;
  ushort local_fd8;
  ushort local_fd6;
  ushort local_fd4;
  ushort local_fd2;
  ushort local_fd0;
  ushort local_fce;
  ushort local_fcc;
  ushort local_fca;
  ushort local_fc8;
  ushort local_fc6;
  ushort local_fc4;
  ushort local_fc2;
  undefined1 local_fc0 [16];
  undefined1 auStack_fb0 [16];
  undefined2 local_fa0;
  undefined2 local_f9e;
  undefined2 local_f9c;
  undefined2 local_f9a;
  undefined2 local_f98;
  undefined2 local_f96;
  undefined2 local_f94;
  undefined2 local_f92;
  undefined2 local_f90;
  undefined2 local_f8e;
  undefined2 local_f8c;
  undefined2 local_f8a;
  undefined2 local_f88;
  undefined2 local_f86;
  undefined2 local_f84;
  undefined2 local_f82;
  undefined1 local_f80 [32];
  undefined2 local_f60;
  undefined2 local_f5e;
  undefined2 local_f5c;
  undefined2 local_f5a;
  undefined2 local_f58;
  undefined2 local_f56;
  undefined2 local_f54;
  undefined2 local_f52;
  undefined2 local_f50;
  undefined2 local_f4e;
  undefined2 local_f4c;
  undefined2 local_f4a;
  undefined2 local_f48;
  undefined2 local_f46;
  undefined2 local_f44;
  undefined2 local_f42;
  undefined1 local_f40 [32];
  undefined2 local_f20;
  undefined2 local_f1e;
  undefined2 local_f1c;
  undefined2 local_f1a;
  undefined2 local_f18;
  undefined2 local_f16;
  undefined2 local_f14;
  undefined2 local_f12;
  undefined2 local_f10;
  undefined2 local_f0e;
  undefined2 local_f0c;
  undefined2 local_f0a;
  undefined2 local_f08;
  undefined2 local_f06;
  undefined2 local_f04;
  undefined2 local_f02;
  undefined1 local_f00 [32];
  ushort local_ee0;
  ushort local_ede;
  ushort local_edc;
  ushort local_eda;
  ushort local_ed8;
  ushort local_ed6;
  ushort local_ed4;
  ushort local_ed2;
  ushort local_ed0;
  ushort local_ece;
  ushort local_ecc;
  ushort local_eca;
  ushort local_ec8;
  ushort local_ec6;
  ushort local_ec4;
  ushort local_ec2;
  undefined1 local_ec0 [16];
  undefined1 auStack_eb0 [16];
  undefined2 local_ea0;
  undefined2 local_e9e;
  undefined2 local_e9c;
  undefined2 local_e9a;
  undefined2 local_e98;
  undefined2 local_e96;
  undefined2 local_e94;
  undefined2 local_e92;
  undefined2 local_e90;
  undefined2 local_e8e;
  undefined2 local_e8c;
  undefined2 local_e8a;
  undefined2 local_e88;
  undefined2 local_e86;
  undefined2 local_e84;
  undefined2 local_e82;
  undefined1 local_e80 [16];
  undefined1 auStack_e70 [16];
  ushort local_e60;
  ushort local_e5e;
  ushort local_e5c;
  ushort local_e5a;
  ushort local_e58;
  ushort local_e56;
  ushort local_e54;
  ushort local_e52;
  ushort local_e50;
  ushort local_e4e;
  ushort local_e4c;
  ushort local_e4a;
  ushort local_e48;
  ushort local_e46;
  ushort local_e44;
  ushort local_e42;
  undefined1 local_e40 [32];
  ushort local_e20;
  ushort local_e1e;
  ushort local_e1c;
  ushort local_e1a;
  ushort local_e18;
  ushort local_e16;
  ushort local_e14;
  ushort local_e12;
  ushort local_e10;
  ushort local_e0e;
  ushort local_e0c;
  ushort local_e0a;
  ushort local_e08;
  ushort local_e06;
  ushort local_e04;
  ushort local_e02;
  undefined1 local_e00 [32];
  undefined2 local_de0;
  undefined2 local_dde;
  undefined2 local_ddc;
  undefined2 local_dda;
  undefined2 local_dd8;
  undefined2 local_dd6;
  undefined2 local_dd4;
  undefined2 local_dd2;
  undefined2 local_dd0;
  undefined2 local_dce;
  undefined2 local_dcc;
  undefined2 local_dca;
  undefined2 local_dc8;
  undefined2 local_dc6;
  undefined2 local_dc4;
  undefined2 local_dc2;
  undefined1 local_dc0 [16];
  undefined1 auStack_db0 [16];
  ushort local_da0;
  ushort local_d9e;
  ushort local_d9c;
  ushort local_d9a;
  ushort local_d98;
  ushort local_d96;
  ushort local_d94;
  ushort local_d92;
  ushort local_d90;
  ushort local_d8e;
  ushort local_d8c;
  ushort local_d8a;
  ushort local_d88;
  ushort local_d86;
  ushort local_d84;
  ushort local_d82;
  undefined1 local_d80 [32];
  ushort local_d60;
  ushort local_d5e;
  ushort local_d5c;
  ushort local_d5a;
  ushort local_d58;
  ushort local_d56;
  ushort local_d54;
  ushort local_d52;
  ushort local_d50;
  ushort local_d4e;
  ushort local_d4c;
  ushort local_d4a;
  ushort local_d48;
  ushort local_d46;
  ushort local_d44;
  short local_d42;
  undefined1 local_d40 [16];
  undefined1 auStack_d30 [16];
  undefined2 local_d20;
  undefined2 local_d1e;
  undefined2 local_d1c;
  undefined2 local_d1a;
  undefined2 local_d18;
  undefined2 local_d16;
  undefined2 local_d14;
  undefined2 local_d12;
  undefined2 local_d10;
  undefined2 local_d0e;
  undefined2 local_d0c;
  undefined2 local_d0a;
  undefined2 local_d08;
  undefined2 local_d06;
  undefined2 local_d04;
  undefined2 local_d02;
  undefined1 local_d00 [16];
  undefined1 auStack_cf0 [16];
  undefined2 local_ce0;
  undefined2 local_cde;
  undefined2 local_cdc;
  undefined2 local_cda;
  undefined2 local_cd8;
  undefined2 local_cd6;
  undefined2 local_cd4;
  undefined2 local_cd2;
  undefined2 local_cd0;
  undefined2 local_cce;
  undefined2 local_ccc;
  undefined2 local_cca;
  undefined2 local_cc8;
  undefined2 local_cc6;
  undefined2 local_cc4;
  undefined2 local_cc2;
  undefined1 local_cc0 [16];
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [16];
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [16];
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  
  local_1150 = 0;
  local_1154 = 0;
  local_1158 = 0;
  local_115c = 0;
  local_1160 = 0;
  local_1164 = 0;
  local_1170 = (int16_t *)0x0;
  local_1178 = (int16_t *)0x0;
  local_1180 = (int16_t *)0x0;
  local_1188 = (int16_t *)0x0;
  local_1190 = (int16_t *)0x0;
  local_1198 = (int16_t *)0x0;
  local_11a0 = (int16_t *)0x0;
  local_11a8 = (parasail_result_t *)0x0;
  local_11ac = 0;
  local_11b0 = 0;
  local_11b4 = 0;
  local_11b8 = 0;
  local_11ba = 0;
  local_11bc = 0;
  local_11be = 0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_avx2_256_16","_s2");
    local_1128 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_avx2_256_16","s2Len");
    local_1128 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_avx2_256_16","open");
    local_1128 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_diag_avx2_256_16","gap");
    local_1128 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_avx2_256_16","matrix");
    local_1128 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 0) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_diag_avx2_256_16","_s1");
        return (parasail_result_t *)0x0;
      }
      if ((int)in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_diag_avx2_256_16","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_1150 = 0x10;
    local_1154 = 0xf;
    local_1158 = 0x1e;
    local_17d8 = in_ESI;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      local_17d8 = *(uint *)(in_stack_00000008 + 0x34);
    }
    local_115c = local_17d8;
    uVar41 = local_115c;
    local_1160 = local_17d8 + 0xf;
    local_1164 = in_ECX + 0xf;
    local_11ac = 0;
    local_11b0 = 0;
    local_11b4 = 0;
    local_11b8 = 0;
    local_1148._0_2_ = (ushort)in_R8D;
    local_11be = (ushort)local_1148;
    if (*(int *)(in_stack_00000008 + 0x20) <= (int)-in_R8D) {
      local_11be = -(short)*(undefined4 *)(in_stack_00000008 + 0x20);
    }
    local_11be = local_11be + 0x8001;
    local_11bc = ((ushort)*(undefined4 *)(in_stack_00000008 + 0x1c) ^ 0x7fff) - 1;
    auVar30 = vpinsrw_avx(ZEXT216(local_11be),(uint)local_11be,1);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,2);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,3);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,4);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,5);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,6);
    local_1100 = vpinsrw_avx(auVar30,(uint)local_11be,7);
    auVar30 = vpinsrw_avx(ZEXT216(local_11be),(uint)local_11be,1);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,2);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,3);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,4);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,5);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,6);
    auStack_10f0 = vpinsrw_avx(auVar30,(uint)local_11be,7);
    local_11e0 = local_1100._0_8_;
    uStack_11d8 = local_1100._8_8_;
    uStack_11d0 = auStack_10f0._0_8_;
    uStack_11c8 = auStack_10f0._8_8_;
    auVar30 = vpinsrw_avx(ZEXT216(local_11bc),(uint)local_11bc,1);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,2);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,3);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,4);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,5);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,6);
    local_10c0 = vpinsrw_avx(auVar30,(uint)local_11bc,7);
    auVar30 = vpinsrw_avx(ZEXT216(local_11bc),(uint)local_11bc,1);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,2);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,3);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,4);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,5);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11bc,6);
    auStack_10b0 = vpinsrw_avx(auVar30,(uint)local_11bc,7);
    local_1200 = local_10c0._0_8_;
    uStack_11f8 = local_10c0._8_8_;
    uStack_11f0 = auStack_10b0._0_8_;
    uStack_11e8 = auStack_10b0._8_8_;
    local_1220._16_8_ = auStack_10b0._0_8_;
    local_1220._0_16_ = local_10c0;
    local_1220._24_8_ = auStack_10b0._8_8_;
    local_1240._16_8_ = auStack_10f0._0_8_;
    local_1240._0_16_ = local_1100;
    local_1240._24_8_ = auStack_10f0._8_8_;
    auVar30 = vpinsrw_avx(ZEXT216(local_11be),(uint)local_11be,1);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,2);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,3);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,4);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,5);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,6);
    local_1080 = vpinsrw_avx(auVar30,(uint)local_11be,7);
    auVar30 = vpinsrw_avx(ZEXT216(local_11be),(uint)local_11be,1);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,2);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,3);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,4);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,5);
    auVar30 = vpinsrw_avx(auVar30,(uint)local_11be,6);
    auStack_1070 = vpinsrw_avx(auVar30,(uint)local_11be,7);
    local_1260 = local_1080._0_8_;
    uStack_1258 = local_1080._8_8_;
    uStack_1250 = auStack_1070._0_8_;
    uStack_1248 = auStack_1070._8_8_;
    local_1108 = (ushort)local_1148;
    local_1002 = (ushort)local_1148;
    local_1004 = (ushort)local_1148;
    local_1006 = (ushort)local_1148;
    local_1008 = (ushort)local_1148;
    local_100a = (ushort)local_1148;
    local_100c = (ushort)local_1148;
    local_100e = (ushort)local_1148;
    local_1010 = (ushort)local_1148;
    local_1012 = (ushort)local_1148;
    local_1014 = (ushort)local_1148;
    local_1016 = (ushort)local_1148;
    local_1018 = (ushort)local_1148;
    local_101a = (ushort)local_1148;
    local_101c = (ushort)local_1148;
    local_101e = (ushort)local_1148;
    local_1020 = (ushort)local_1148;
    auVar30 = vpinsrw_avx(ZEXT216((ushort)local_1148),in_R8D & 0xffff,1);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,2);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,3);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,4);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,5);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,6);
    local_1040 = vpinsrw_avx(auVar30,in_R8D & 0xffff,7);
    auVar30 = vpinsrw_avx(ZEXT216((ushort)local_1148),in_R8D & 0xffff,1);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,2);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,3);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,4);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,5);
    auVar30 = vpinsrw_avx(auVar30,in_R8D & 0xffff,6);
    auStack_1030 = vpinsrw_avx(auVar30,in_R8D & 0xffff,7);
    local_1280 = local_1040._0_8_;
    uStack_1278 = local_1040._8_8_;
    uStack_1270 = auStack_1030._0_8_;
    uStack_1268 = auStack_1030._8_8_;
    local_114c._0_2_ = (ushort)in_R9D;
    local_110a = (ushort)local_114c;
    local_fc2 = (ushort)local_114c;
    local_fc4 = (ushort)local_114c;
    local_fc6 = (ushort)local_114c;
    local_fc8 = (ushort)local_114c;
    local_fca = (ushort)local_114c;
    local_fcc = (ushort)local_114c;
    local_fce = (ushort)local_114c;
    local_fd0 = (ushort)local_114c;
    local_fd2 = (ushort)local_114c;
    local_fd4 = (ushort)local_114c;
    local_fd6 = (ushort)local_114c;
    local_fd8 = (ushort)local_114c;
    local_fda = (ushort)local_114c;
    local_fdc = (ushort)local_114c;
    local_fde = (ushort)local_114c;
    local_fe0 = (ushort)local_114c;
    auVar30 = vpinsrw_avx(ZEXT216((ushort)local_114c),in_R9D & 0xffff,1);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,2);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,3);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,4);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,5);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,6);
    local_1000 = vpinsrw_avx(auVar30,in_R9D & 0xffff,7);
    auVar30 = vpinsrw_avx(ZEXT216((ushort)local_114c),in_R9D & 0xffff,1);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,2);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,3);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,4);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,5);
    auVar30 = vpinsrw_avx(auVar30,in_R9D & 0xffff,6);
    auStack_ff0 = vpinsrw_avx(auVar30,in_R9D & 0xffff,7);
    local_12a0 = local_1000._0_8_;
    uStack_1298 = local_1000._8_8_;
    uStack_1290 = auStack_ff0._0_8_;
    uStack_1288 = auStack_ff0._8_8_;
    local_110c = 1;
    local_f82 = 1;
    local_f84 = 1;
    local_f86 = 1;
    local_f88 = 1;
    local_f8a = 1;
    local_f8c = 1;
    local_f8e = 1;
    local_f90 = 1;
    local_f92 = 1;
    local_f94 = 1;
    local_f96 = 1;
    local_f98 = 1;
    local_f9a = 1;
    local_f9c = 1;
    local_f9e = 1;
    local_fa0 = 1;
    auVar30 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar30 = vpinsrw_avx(auVar30,1,2);
    auVar30 = vpinsrw_avx(auVar30,1,3);
    auVar30 = vpinsrw_avx(auVar30,1,4);
    auVar30 = vpinsrw_avx(auVar30,1,5);
    auVar30 = vpinsrw_avx(auVar30,1,6);
    local_fc0 = vpinsrw_avx(auVar30,1,7);
    auVar30 = vpinsrw_avx(ZEXT216(1),1,1);
    auVar30 = vpinsrw_avx(auVar30,1,2);
    auVar30 = vpinsrw_avx(auVar30,1,3);
    auVar30 = vpinsrw_avx(auVar30,1,4);
    auVar30 = vpinsrw_avx(auVar30,1,5);
    auVar30 = vpinsrw_avx(auVar30,1,6);
    auStack_fb0 = vpinsrw_avx(auVar30,1,7);
    local_12c0 = local_fc0._0_8_;
    uStack_12b8 = local_fc0._8_8_;
    uStack_12b0 = auStack_fb0._0_8_;
    uStack_12a8 = auStack_fb0._8_8_;
    local_110e = 0x10;
    local_f42 = 0x10;
    local_f44 = 0x10;
    local_f46 = 0x10;
    local_f48 = 0x10;
    local_f4a = 0x10;
    local_f4c = 0x10;
    local_f4e = 0x10;
    local_f50 = 0x10;
    local_f52 = 0x10;
    local_f54 = 0x10;
    local_f56 = 0x10;
    local_f58 = 0x10;
    local_f5a = 0x10;
    local_f5c = 0x10;
    local_f5e = 0x10;
    local_f60 = 0x10;
    auVar30 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar30 = vpinsrw_avx(auVar30,0x10,2);
    auVar30 = vpinsrw_avx(auVar30,0x10,3);
    auVar30 = vpinsrw_avx(auVar30,0x10,4);
    auVar30 = vpinsrw_avx(auVar30,0x10,5);
    auVar30 = vpinsrw_avx(auVar30,0x10,6);
    auVar30 = vpinsrw_avx(auVar30,0x10,7);
    auVar31 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar31 = vpinsrw_avx(auVar31,0x10,2);
    auVar31 = vpinsrw_avx(auVar31,0x10,3);
    auVar31 = vpinsrw_avx(auVar31,0x10,4);
    auVar31 = vpinsrw_avx(auVar31,0x10,5);
    auVar31 = vpinsrw_avx(auVar31,0x10,6);
    auVar31 = vpinsrw_avx(auVar31,0x10,7);
    local_f80._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar31;
    local_f80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
    if ((int)matrix == 0) {
      local_1112 = (ushort)local_114c * 0x10;
      auVar30 = vpinsrw_avx(ZEXT216(local_1112),(uint)local_1112,1);
      auVar30 = vpinsrw_avx(auVar30,(uint)local_1112,2);
      auVar30 = vpinsrw_avx(auVar30,(uint)local_1112,3);
      auVar30 = vpinsrw_avx(auVar30,(uint)local_1112,4);
      auVar30 = vpinsrw_avx(auVar30,(uint)local_1112,5);
      auVar30 = vpinsrw_avx(auVar30,(uint)local_1112,6);
      auVar30 = vpinsrw_avx(auVar30,(uint)local_1112,7);
      auVar31 = vpinsrw_avx(ZEXT216(local_1112),(uint)local_1112,1);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_1112,2);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_1112,3);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_1112,4);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_1112,5);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_1112,6);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_1112,7);
      local_f00._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar31;
      local_f00._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
      local_ee0 = local_1112;
      local_ede = local_1112;
      local_edc = local_1112;
      local_eda = local_1112;
      local_ed8 = local_1112;
      local_ed6 = local_1112;
      local_ed4 = local_1112;
      local_ed2 = local_1112;
      local_ed0 = local_1112;
      local_ece = local_1112;
      local_ecc = local_1112;
      local_eca = local_1112;
      local_ec8 = local_1112;
      local_ec6 = local_1112;
      local_ec4 = local_1112;
      local_ec2 = local_1112;
      local_1300 = local_f00._0_16_;
      auStack_12f0 = local_f00._16_16_;
    }
    else {
      local_1110 = 0;
      local_f02 = 0;
      local_f04 = 0;
      local_f06 = 0;
      local_f08 = 0;
      local_f0a = 0;
      local_f0c = 0;
      local_f0e = 0;
      local_f10 = 0;
      local_f12 = 0;
      local_f14 = 0;
      local_f16 = 0;
      local_f18 = 0;
      local_f1a = 0;
      local_f1c = 0;
      local_f1e = 0;
      local_f20 = 0;
      auVar30 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar30 = vpinsrw_avx(auVar30,0,2);
      auVar30 = vpinsrw_avx(auVar30,0,3);
      auVar30 = vpinsrw_avx(auVar30,0,4);
      auVar30 = vpinsrw_avx(auVar30,0,5);
      auVar30 = vpinsrw_avx(auVar30,0,6);
      auVar30 = vpinsrw_avx(auVar30,0,7);
      auVar31 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar31 = vpinsrw_avx(auVar31,0,2);
      auVar31 = vpinsrw_avx(auVar31,0,3);
      auVar31 = vpinsrw_avx(auVar31,0,4);
      auVar31 = vpinsrw_avx(auVar31,0,5);
      auVar31 = vpinsrw_avx(auVar31,0,6);
      auVar31 = vpinsrw_avx(auVar31,0,7);
      local_f40._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar31;
      local_f40._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
      local_1300 = local_f40._0_16_;
      auStack_12f0 = local_f40._16_16_;
    }
    local_1114 = 0xffff;
    local_e82 = 0xffff;
    local_e84 = 0xffff;
    local_e86 = 0xffff;
    local_e88 = 0xffff;
    local_e8a = 0xffff;
    local_e8c = 0xffff;
    local_e8e = 0xffff;
    local_e90 = 0xffff;
    local_e92 = 0xffff;
    local_e94 = 0xffff;
    local_e96 = 0xffff;
    local_e98 = 0xffff;
    local_e9a = 0xffff;
    local_e9c = 0xffff;
    local_e9e = 0xffff;
    local_ea0 = 0xffff;
    auVar30 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
    auVar30 = vpinsrw_avx(auVar30,0xffff,2);
    auVar30 = vpinsrw_avx(auVar30,0xffff,3);
    auVar30 = vpinsrw_avx(auVar30,0xffff,4);
    auVar30 = vpinsrw_avx(auVar30,0xffff,5);
    auVar30 = vpinsrw_avx(auVar30,0xffff,6);
    local_ec0 = vpinsrw_avx(auVar30,0xffff,7);
    auVar30 = vpinsrw_avx(ZEXT216(0xffff),0xffff,1);
    auVar30 = vpinsrw_avx(auVar30,0xffff,2);
    auVar30 = vpinsrw_avx(auVar30,0xffff,3);
    auVar30 = vpinsrw_avx(auVar30,0xffff,4);
    auVar30 = vpinsrw_avx(auVar30,0xffff,5);
    auVar30 = vpinsrw_avx(auVar30,0xffff,6);
    auStack_eb0 = vpinsrw_avx(auVar30,0xffff,7);
    local_1320 = local_ec0._0_8_;
    uStack_1318 = local_ec0._8_8_;
    uStack_1310 = auStack_eb0._0_8_;
    uStack_1308 = auStack_eb0._8_8_;
    local_cc2 = 0;
    local_cc4 = 1;
    local_cc6 = 2;
    local_cc8 = 3;
    local_cca = 4;
    local_ccc = 5;
    local_cce = 6;
    local_cd0 = 7;
    local_cd2 = 8;
    local_cd4 = 9;
    local_cd6 = 10;
    local_cd8 = 0xb;
    local_cda = 0xc;
    local_cdc = 0xd;
    local_cde = 0xe;
    local_ce0 = 0xf;
    auVar30 = vpinsrw_avx(ZEXT216(0xf),0xe,1);
    auVar30 = vpinsrw_avx(auVar30,0xd,2);
    auVar30 = vpinsrw_avx(auVar30,0xc,3);
    auVar30 = vpinsrw_avx(auVar30,0xb,4);
    auVar30 = vpinsrw_avx(auVar30,10,5);
    auVar30 = vpinsrw_avx(auVar30,9,6);
    local_d00 = vpinsrw_avx(auVar30,8,7);
    auVar30 = vpinsrw_avx(ZEXT216(7),6,1);
    auVar30 = vpinsrw_avx(auVar30,5,2);
    auVar30 = vpinsrw_avx(auVar30,4,3);
    auVar30 = vpinsrw_avx(auVar30,3,4);
    auVar30 = vpinsrw_avx(auVar30,2,5);
    auVar30 = vpinsrw_avx(auVar30,1,6);
    auStack_cf0 = vpinsrw_avx(auVar30,0,7);
    local_1340._16_8_ = auStack_cf0._0_8_;
    local_1340._0_16_ = local_d00;
    local_1340._24_8_ = auStack_cf0._8_8_;
    local_d02 = 0;
    local_d04 = 0xffff;
    local_d06 = 0xfffe;
    local_d08 = 0xfffd;
    local_d0a = 0xfffc;
    local_d0c = 0xfffb;
    local_d0e = 0xfffa;
    local_d10 = 0xfff9;
    local_d12 = 0xfff8;
    local_d14 = 0xfff7;
    local_d16 = 0xfff6;
    local_d18 = 0xfff5;
    local_d1a = 0xfff4;
    local_d1c = 0xfff3;
    local_d1e = 0xfff2;
    local_d20 = 0xfff1;
    auVar30 = vpinsrw_avx(ZEXT216(0xfff1),0xfff2,1);
    auVar30 = vpinsrw_avx(auVar30,0xfff3,2);
    auVar30 = vpinsrw_avx(auVar30,0xfff4,3);
    auVar30 = vpinsrw_avx(auVar30,0xfff5,4);
    auVar30 = vpinsrw_avx(auVar30,0xfff6,5);
    auVar30 = vpinsrw_avx(auVar30,0xfff7,6);
    local_d40 = vpinsrw_avx(auVar30,0xfff8,7);
    auVar30 = vpinsrw_avx(ZEXT216(0xfff9),0xfffa,1);
    auVar30 = vpinsrw_avx(auVar30,0xfffb,2);
    auVar30 = vpinsrw_avx(auVar30,0xfffc,3);
    auVar30 = vpinsrw_avx(auVar30,0xfffd,4);
    auVar30 = vpinsrw_avx(auVar30,0xfffe,5);
    auVar30 = vpinsrw_avx(auVar30,0xffff,6);
    auStack_d30 = vpinsrw_avx(auVar30,0,7);
    local_1360 = local_d40._0_8_;
    uStack_1358 = local_d40._8_8_;
    uStack_1350 = auStack_d30._0_8_;
    uStack_1348 = auStack_d30._8_8_;
    local_1380._16_8_ = auStack_1070._0_8_;
    local_1380._0_16_ = local_1080;
    local_1380._24_8_ = auStack_1070._8_8_;
    local_13a0._16_8_ = auStack_1070._0_8_;
    local_13a0._0_16_ = local_1080;
    local_13a0._24_8_ = auStack_1070._8_8_;
    local_13c0._16_8_ = auStack_1070._0_8_;
    local_13c0._0_16_ = local_1080;
    local_13c0._24_8_ = auStack_1070._8_8_;
    local_13e0._16_8_ = auStack_1070._0_8_;
    local_13e0._0_16_ = local_1080;
    local_13e0._24_8_ = auStack_1070._8_8_;
    local_1400._16_8_ = auStack_1070._0_8_;
    local_1400._0_16_ = local_1080;
    local_1400._24_8_ = auStack_1070._8_8_;
    local_115c._0_2_ = (ushort)local_17d8;
    local_1116 = (ushort)local_115c;
    local_e42 = (ushort)local_115c;
    local_e44 = (ushort)local_115c;
    local_e46 = (ushort)local_115c;
    local_e48 = (ushort)local_115c;
    local_e4a = (ushort)local_115c;
    local_e4c = (ushort)local_115c;
    local_e4e = (ushort)local_115c;
    local_e50 = (ushort)local_115c;
    local_e52 = (ushort)local_115c;
    local_e54 = (ushort)local_115c;
    local_e56 = (ushort)local_115c;
    local_e58 = (ushort)local_115c;
    local_e5a = (ushort)local_115c;
    local_e5c = (ushort)local_115c;
    local_e5e = (ushort)local_115c;
    local_e60 = (ushort)local_115c;
    auVar30 = vpinsrw_avx(ZEXT216((ushort)local_115c),local_17d8 & 0xffff,1);
    auVar30 = vpinsrw_avx(auVar30,local_17d8 & 0xffff,2);
    auVar30 = vpinsrw_avx(auVar30,local_17d8 & 0xffff,3);
    auVar30 = vpinsrw_avx(auVar30,local_17d8 & 0xffff,4);
    auVar30 = vpinsrw_avx(auVar30,local_17d8 & 0xffff,5);
    auVar30 = vpinsrw_avx(auVar30,local_17d8 & 0xffff,6);
    auVar30 = vpinsrw_avx(auVar30,local_17d8 & 0xffff,7);
    auVar31 = vpinsrw_avx(ZEXT216((ushort)local_115c),local_17d8 & 0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,local_17d8 & 0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,local_17d8 & 0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,local_17d8 & 0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,local_17d8 & 0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,local_17d8 & 0xffff,6);
    auStack_e70 = vpinsrw_avx(auVar31,local_17d8 & 0xffff,7);
    local_e80._0_8_ = auVar30._0_8_;
    uVar59 = local_e80._0_8_;
    local_e80._8_8_ = auVar30._8_8_;
    uVar60 = local_e80._8_8_;
    uVar61 = auStack_e70._0_8_;
    uVar62 = auStack_e70._8_8_;
    local_b20 = local_e80._0_8_;
    uStack_b18 = local_e80._8_8_;
    uStack_b10 = auStack_e70._0_8_;
    uStack_b08 = auStack_e70._8_8_;
    local_b40 = local_fc0._0_8_;
    uStack_b38 = local_fc0._8_8_;
    uStack_b30 = auStack_fb0._0_8_;
    uStack_b28 = auStack_fb0._8_8_;
    auVar34._16_8_ = auStack_e70._0_8_;
    auVar34._0_16_ = auVar30;
    auVar34._24_8_ = auStack_e70._8_8_;
    auVar39._16_8_ = auStack_fb0._0_8_;
    auVar39._0_16_ = local_fc0;
    auVar39._24_8_ = auStack_fb0._8_8_;
    auVar39 = vpsubsw_avx2(auVar34,auVar39);
    local_1144._0_2_ = (ushort)in_ECX;
    local_1118 = (ushort)local_1144;
    local_e02 = (ushort)local_1144;
    local_e04 = (ushort)local_1144;
    local_e06 = (ushort)local_1144;
    local_e08 = (ushort)local_1144;
    local_e0a = (ushort)local_1144;
    local_e0c = (ushort)local_1144;
    local_e0e = (ushort)local_1144;
    local_e10 = (ushort)local_1144;
    local_e12 = (ushort)local_1144;
    local_e14 = (ushort)local_1144;
    local_e16 = (ushort)local_1144;
    local_e18 = (ushort)local_1144;
    local_e1a = (ushort)local_1144;
    local_e1c = (ushort)local_1144;
    local_e1e = (ushort)local_1144;
    local_e20 = (ushort)local_1144;
    auVar31 = vpinsrw_avx(ZEXT216((ushort)local_1144),in_ECX & 0xffff,1);
    auVar31 = vpinsrw_avx(auVar31,in_ECX & 0xffff,2);
    auVar31 = vpinsrw_avx(auVar31,in_ECX & 0xffff,3);
    auVar31 = vpinsrw_avx(auVar31,in_ECX & 0xffff,4);
    auVar31 = vpinsrw_avx(auVar31,in_ECX & 0xffff,5);
    auVar31 = vpinsrw_avx(auVar31,in_ECX & 0xffff,6);
    auVar31 = vpinsrw_avx(auVar31,in_ECX & 0xffff,7);
    auVar32 = vpinsrw_avx(ZEXT216((ushort)local_1144),in_ECX & 0xffff,1);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,2);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,3);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,4);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,5);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,6);
    auVar32 = vpinsrw_avx(auVar32,in_ECX & 0xffff,7);
    auVar66._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar32;
    auVar66._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
    local_e40._16_8_ = auVar66._16_8_;
    uVar63 = local_e40._16_8_;
    local_e40._24_8_ = auVar66._24_8_;
    uVar64 = local_e40._24_8_;
    local_b80 = local_fc0._0_8_;
    uStack_b78 = local_fc0._8_8_;
    uStack_b70 = auStack_fb0._0_8_;
    uStack_b68 = auStack_fb0._8_8_;
    auVar33._16_8_ = local_e40._16_8_;
    auVar33._0_16_ = auVar66._0_16_;
    auVar33._24_8_ = local_e40._24_8_;
    auVar40._16_8_ = auStack_fb0._0_8_;
    auVar40._0_16_ = local_fc0;
    auVar40._24_8_ = auStack_fb0._8_8_;
    auVar40 = vpsubsw_avx2(auVar33,auVar40);
    if ((int)matrix == 0) {
      local_d42 = (short)-in_R8D;
      local_d44 = local_d42 - (ushort)local_114c;
      local_d46 = local_d42 + (ushort)local_114c * -2;
      local_d48 = local_d42 + (ushort)local_114c * -3;
      sVar42 = (short)(in_R9D << 2);
      local_d4a = local_d42 - sVar42;
      local_d4c = local_d42 + (ushort)local_114c * -5;
      local_d4e = local_d42 + (ushort)local_114c * -6;
      sVar43 = (short)(in_R9D << 3);
      local_d50 = ((ushort)local_114c - sVar43) - (ushort)local_1148;
      local_d52 = local_d42 - sVar43;
      local_d54 = local_d42 + (ushort)local_114c * -9;
      local_d56 = local_d42 + (ushort)local_114c * -10;
      local_d58 = local_d42 + (ushort)local_114c * -0xb;
      local_d5a = local_d42 + sVar42 * -3;
      local_d5c = local_d42 + (ushort)local_114c * -0xd;
      local_d5e = ((ushort)local_114c * 2 - (short)(in_R9D << 4)) - (ushort)local_1148;
      local_d60 = local_d42 + (ushort)local_114c * -0xf;
      auVar31 = vpinsrw_avx(ZEXT216(local_d50),(uint)local_d4e,1);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_d4c,2);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_d4a,3);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_d48,4);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_d46,5);
      auVar31 = vpinsrw_avx(auVar31,(uint)local_d44,6);
      auVar31 = vpinsrw_avx(auVar31,-in_R8D & 0xffff,7);
      auVar32 = vpinsrw_avx(ZEXT216(local_d60),(uint)local_d5e,1);
      auVar32 = vpinsrw_avx(auVar32,(uint)local_d5c,2);
      auVar32 = vpinsrw_avx(auVar32,(uint)local_d5a,3);
      auVar32 = vpinsrw_avx(auVar32,(uint)local_d58,4);
      auVar32 = vpinsrw_avx(auVar32,(uint)local_d56,5);
      auVar32 = vpinsrw_avx(auVar32,(uint)local_d54,6);
      auVar32 = vpinsrw_avx(auVar32,(uint)local_d52,7);
      local_d80._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar32;
      local_d80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
      local_14a0._0_16_ = local_d80._0_16_;
      auVar31 = local_d80._16_16_;
    }
    else {
      local_111a = 0;
      local_dc2 = 0;
      local_dc4 = 0;
      local_dc6 = 0;
      local_dc8 = 0;
      local_dca = 0;
      local_dcc = 0;
      local_dce = 0;
      local_dd0 = 0;
      local_dd2 = 0;
      local_dd4 = 0;
      local_dd6 = 0;
      local_dd8 = 0;
      local_dda = 0;
      local_ddc = 0;
      local_dde = 0;
      local_de0 = 0;
      auVar31 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar31 = vpinsrw_avx(auVar31,0,2);
      auVar31 = vpinsrw_avx(auVar31,0,3);
      auVar31 = vpinsrw_avx(auVar31,0,4);
      auVar31 = vpinsrw_avx(auVar31,0,5);
      auVar31 = vpinsrw_avx(auVar31,0,6);
      auVar31 = vpinsrw_avx(auVar31,0,7);
      auVar32 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar32 = vpinsrw_avx(auVar32,0,2);
      auVar32 = vpinsrw_avx(auVar32,0,3);
      auVar32 = vpinsrw_avx(auVar32,0,4);
      auVar32 = vpinsrw_avx(auVar32,0,5);
      auVar32 = vpinsrw_avx(auVar32,0,6);
      auVar32 = vpinsrw_avx(auVar32,0,7);
      local_e00._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar32;
      local_e00._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
      local_14a0._0_16_ = local_e00._0_16_;
      auVar31 = local_e00._16_16_;
    }
    uStack_1848 = auVar31._8_8_;
    uStack_1850 = auVar31._0_8_;
    local_14a0._16_8_ = uStack_1850;
    local_14a0._24_8_ = uStack_1848;
    local_11ba = local_11be;
    local_115c = uVar41;
    local_114c = in_R9D;
    local_1148 = in_R8D;
    local_1144 = in_ECX;
    local_1140 = in_RDX;
    local_1130 = in_RDI;
    local_1106 = local_11be;
    local_1104 = local_11bc;
    local_1102 = local_11be;
    local_10e0 = local_11be;
    local_10de = local_11be;
    local_10dc = local_11be;
    local_10da = local_11be;
    local_10d8 = local_11be;
    local_10d6 = local_11be;
    local_10d4 = local_11be;
    local_10d2 = local_11be;
    local_10d0 = local_11be;
    local_10ce = local_11be;
    local_10cc = local_11be;
    local_10ca = local_11be;
    local_10c8 = local_11be;
    local_10c6 = local_11be;
    local_10c4 = local_11be;
    local_10c2 = local_11be;
    local_10a0 = local_11bc;
    local_109e = local_11bc;
    local_109c = local_11bc;
    local_109a = local_11bc;
    local_1098 = local_11bc;
    local_1096 = local_11bc;
    local_1094 = local_11bc;
    local_1092 = local_11bc;
    local_1090 = local_11bc;
    local_108e = local_11bc;
    local_108c = local_11bc;
    local_108a = local_11bc;
    local_1088 = local_11bc;
    local_1086 = local_11bc;
    local_1084 = local_11bc;
    local_1082 = local_11bc;
    local_1060 = local_11be;
    local_105e = local_11be;
    local_105c = local_11be;
    local_105a = local_11be;
    local_1058 = local_11be;
    local_1056 = local_11be;
    local_1054 = local_11be;
    local_1052 = local_11be;
    local_1050 = local_11be;
    local_104e = local_11be;
    local_104c = local_11be;
    local_104a = local_11be;
    local_1048 = local_11be;
    local_1046 = local_11be;
    local_1044 = local_11be;
    local_1042 = local_11be;
    local_e80 = auVar30;
    local_e40 = auVar66;
    local_12e0 = local_f80._0_16_;
    auStack_12d0 = local_f80._16_16_;
    local_b60 = auVar66._0_16_;
    auStack_b50 = auVar66._16_16_;
    local_11a8 = parasail_result_new_table1(local_17d8,in_ECX);
    if (local_11a8 == (parasail_result_t *)0x0) {
      local_1128 = (parasail_result_t *)0x0;
    }
    else {
      local_11a8->flag = local_11a8->flag | 0x10201002;
      uVar41 = 0;
      if ((int)matrix != 0) {
        uVar41 = 8;
      }
      local_11a8->flag = uVar41 | local_11a8->flag;
      uVar41 = 0;
      if (s1_beg != 0) {
        uVar41 = 0x10;
      }
      local_11a8->flag = uVar41 | local_11a8->flag;
      uVar41 = 0;
      if (s1_end != 0) {
        uVar41 = 0x4000;
      }
      local_11a8->flag = uVar41 | local_11a8->flag;
      uVar41 = 0;
      if (s2_beg != 0) {
        uVar41 = 0x8000;
      }
      local_11a8->flag = uVar41 | local_11a8->flag;
      local_11a8->flag = local_11a8->flag | 0x20000;
      local_1178 = parasail_memalign_int16_t(0x20,(long)(int)(local_1144 + local_1158));
      local_1180 = parasail_memalign_int16_t(0x20,(long)(int)(local_1144 + local_1158));
      local_1188 = parasail_memalign_int16_t(0x20,(long)(int)(local_1144 + local_1158));
      local_1190 = local_1178 + local_1154;
      local_1198 = local_1180 + local_1154;
      local_11a0 = local_1188 + local_1154;
      if (local_1178 == (int16_t *)0x0) {
        local_1128 = (parasail_result_t *)0x0;
      }
      else if (local_1180 == (int16_t *)0x0) {
        local_1128 = (parasail_result_t *)0x0;
      }
      else if (local_1188 == (int16_t *)0x0) {
        local_1128 = (parasail_result_t *)0x0;
      }
      else {
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          local_1170 = parasail_memalign_int16_t(0x20,(long)(int)(local_115c + local_1154));
          if (local_1170 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_11ac = 0; (int)local_11ac < (int)local_115c; local_11ac = local_11ac + 1) {
            local_1170[(int)local_11ac] =
                 (int16_t)*(undefined4 *)
                           (*(long *)(in_stack_00000008 + 0x10) +
                           (ulong)*(byte *)(local_1130 + (int)local_11ac) * 4);
          }
          for (local_11ac = local_115c; (int)local_11ac < local_1160; local_11ac = local_11ac + 1) {
            local_1170[(int)local_11ac] = 0;
          }
        }
        for (local_11b0 = 0; (int)local_11b0 < (int)local_1144; local_11b0 = local_11b0 + 1) {
          local_1190[(int)local_11b0] =
               (int16_t)*(undefined4 *)
                         (*(long *)(in_stack_00000008 + 0x10) +
                         (ulong)*(byte *)(local_1140 + (int)local_11b0) * 4);
        }
        for (local_11b0 = -local_1154; (int)local_11b0 < 0; local_11b0 = local_11b0 + 1) {
          local_1190[(int)local_11b0] = 0;
        }
        for (local_11b0 = local_1144; (int)local_11b0 < local_1164; local_11b0 = local_11b0 + 1) {
          local_1190[(int)local_11b0] = 0;
        }
        if (s1_end == 0) {
          for (local_11b0 = 0; (int)local_11b0 < (int)local_1144; local_11b0 = local_11b0 + 1) {
            local_1198[(int)local_11b0] =
                 -((short)local_11b0 * (short)local_114c) - (short)local_1148;
            local_11a0[(int)local_11b0] = local_11ba;
          }
        }
        else {
          for (local_11b0 = 0; (int)local_11b0 < (int)local_1144; local_11b0 = local_11b0 + 1) {
            local_1198[(int)local_11b0] = 0;
            local_11a0[(int)local_11b0] = local_11ba;
          }
        }
        for (local_11b0 = -local_1154; (int)local_11b0 < 0; local_11b0 = local_11b0 + 1) {
          local_1198[(int)local_11b0] = local_11ba;
          local_11a0[(int)local_11b0] = local_11ba;
        }
        for (local_11b0 = local_1144; (int)local_11b0 < (int)(local_1144 + local_1154);
            local_11b0 = local_11b0 + 1) {
          local_1198[(int)local_11b0] = local_11ba;
          local_11a0[(int)local_11b0] = local_11ba;
        }
        local_1198[-1] = 0;
        for (local_11ac = 0; (int)local_11ac < (int)local_115c; local_11ac = local_1150 + local_11ac
            ) {
          local_14c0._8_8_ = uStack_1258;
          local_14c0._0_8_ = local_1260;
          local_14c0._16_8_ = uStack_1250;
          uStack_14a8 = uStack_1248;
          local_14e0._8_8_ = uStack_1258;
          local_14e0._0_8_ = local_1260;
          local_14e0._16_8_ = uStack_1250;
          uStack_14c8 = uStack_1248;
          local_1500._8_8_ = uStack_1258;
          local_1500._0_8_ = local_1260;
          local_1500._16_8_ = uStack_1250;
          local_1500._24_8_ = uStack_1248;
          local_1520._8_8_ = uStack_1258;
          local_1520._0_8_ = local_1260;
          local_1520._16_8_ = uStack_1250;
          uStack_1508 = uStack_1248;
          local_1540._8_8_ = uStack_1358;
          local_1540._0_8_ = local_1360;
          local_1540._16_8_ = uStack_1350;
          local_1540._24_8_ = uStack_1348;
          lVar16 = *(long *)(in_stack_00000008 + 8);
          iVar2 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_189c = (int)local_1170[(int)local_11ac];
          }
          else {
            if ((int)local_11ac < (int)local_115c) {
              local_18a0 = local_11ac;
            }
            else {
              local_18a0 = local_115c - 1;
            }
            local_189c = local_18a0;
          }
          lVar17 = *(long *)(in_stack_00000008 + 8);
          iVar3 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_18b4 = (int)local_1170[(int)(local_11ac + 1)];
          }
          else {
            if ((int)(local_11ac + 1) < (int)local_115c) {
              local_18b8 = local_11ac + 1;
            }
            else {
              local_18b8 = local_115c - 1;
            }
            local_18b4 = local_18b8;
          }
          lVar18 = *(long *)(in_stack_00000008 + 8);
          iVar4 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_18cc = (int)local_1170[(int)(local_11ac + 2)];
          }
          else {
            if ((int)(local_11ac + 2) < (int)local_115c) {
              local_18d0 = local_11ac + 2;
            }
            else {
              local_18d0 = local_115c - 1;
            }
            local_18cc = local_18d0;
          }
          lVar19 = *(long *)(in_stack_00000008 + 8);
          iVar5 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_18e4 = (int)local_1170[(int)(local_11ac + 3)];
          }
          else {
            if ((int)(local_11ac + 3) < (int)local_115c) {
              local_18e8 = local_11ac + 3;
            }
            else {
              local_18e8 = local_115c - 1;
            }
            local_18e4 = local_18e8;
          }
          lVar20 = *(long *)(in_stack_00000008 + 8);
          iVar6 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_18fc = (int)local_1170[(int)(local_11ac + 4)];
          }
          else {
            if ((int)(local_11ac + 4) < (int)local_115c) {
              local_1900 = local_11ac + 4;
            }
            else {
              local_1900 = local_115c - 1;
            }
            local_18fc = local_1900;
          }
          lVar21 = *(long *)(in_stack_00000008 + 8);
          iVar7 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1914 = (int)local_1170[(int)(local_11ac + 5)];
          }
          else {
            if ((int)(local_11ac + 5) < (int)local_115c) {
              local_1918 = local_11ac + 5;
            }
            else {
              local_1918 = local_115c - 1;
            }
            local_1914 = local_1918;
          }
          lVar22 = *(long *)(in_stack_00000008 + 8);
          iVar8 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_192c = (int)local_1170[(int)(local_11ac + 6)];
          }
          else {
            if ((int)(local_11ac + 6) < (int)local_115c) {
              local_1930 = local_11ac + 6;
            }
            else {
              local_1930 = local_115c - 1;
            }
            local_192c = local_1930;
          }
          lVar23 = *(long *)(in_stack_00000008 + 8);
          iVar9 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1944 = (int)local_1170[(int)(local_11ac + 7)];
          }
          else {
            if ((int)(local_11ac + 7) < (int)local_115c) {
              local_1948 = local_11ac + 7;
            }
            else {
              local_1948 = local_115c - 1;
            }
            local_1944 = local_1948;
          }
          lVar24 = *(long *)(in_stack_00000008 + 8);
          iVar10 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_195c = (int)local_1170[(int)(local_11ac + 8)];
          }
          else {
            if ((int)(local_11ac + 8) < (int)local_115c) {
              local_1960 = local_11ac + 8;
            }
            else {
              local_1960 = local_115c - 1;
            }
            local_195c = local_1960;
          }
          lVar25 = *(long *)(in_stack_00000008 + 8);
          iVar11 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1974 = (int)local_1170[(int)(local_11ac + 9)];
          }
          else {
            if ((int)(local_11ac + 9) < (int)local_115c) {
              local_1978 = local_11ac + 9;
            }
            else {
              local_1978 = local_115c - 1;
            }
            local_1974 = local_1978;
          }
          lVar26 = *(long *)(in_stack_00000008 + 8);
          iVar12 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_198c = (int)local_1170[(int)(local_11ac + 10)];
          }
          else {
            if ((int)(local_11ac + 10) < (int)local_115c) {
              local_1990 = local_11ac + 10;
            }
            else {
              local_1990 = local_115c - 1;
            }
            local_198c = local_1990;
          }
          lVar27 = *(long *)(in_stack_00000008 + 8);
          iVar13 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_19a4 = (int)local_1170[(int)(local_11ac + 0xb)];
          }
          else {
            if ((int)(local_11ac + 0xb) < (int)local_115c) {
              local_19a8 = local_11ac + 0xb;
            }
            else {
              local_19a8 = local_115c - 1;
            }
            local_19a4 = local_19a8;
          }
          lVar28 = *(long *)(in_stack_00000008 + 8);
          iVar14 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_19bc = (int)local_1170[(int)(local_11ac + 0xc)];
          }
          else {
            if ((int)(local_11ac + 0xc) < (int)local_115c) {
              local_19c0 = local_11ac + 0xc;
            }
            else {
              local_19c0 = local_115c - 1;
            }
            local_19bc = local_19c0;
          }
          lVar29 = *(long *)(in_stack_00000008 + 8);
          iVar15 = *(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_19d4 = (int)local_1170[(int)(local_11ac + 0xd)];
          }
          else {
            if ((int)(local_11ac + 0xd) < (int)local_115c) {
              local_19d8 = local_11ac + 0xd;
            }
            else {
              local_19d8 = local_115c - 1;
            }
            local_19d4 = local_19d8;
          }
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_19ec = (int)local_1170[(int)(local_11ac + 0xe)];
          }
          else {
            if ((int)(local_11ac + 0xe) < (int)local_115c) {
              local_19f0 = local_11ac + 0xe;
            }
            else {
              local_19f0 = local_115c - 1;
            }
            local_19ec = local_19f0;
          }
          lVar65 = *(long *)(in_stack_00000008 + 8) +
                   (long)(*(int *)(in_stack_00000008 + 0x18) * local_19ec) * 4;
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_1a04 = (int)local_1170[(int)(local_11ac + 0xf)];
          }
          else {
            if ((int)(local_11ac + 0xf) < (int)local_115c) {
              local_1a08 = local_11ac + 0xf;
            }
            else {
              local_1a08 = local_115c - 1;
            }
            local_1a04 = local_1a08;
          }
          lVar1 = *(long *)(in_stack_00000008 + 8) +
                  (long)(*(int *)(in_stack_00000008 + 0x18) * local_1a04) * 4;
          local_960 = uVar59;
          uStack_958 = uVar60;
          uStack_950 = uVar61;
          uStack_948 = uVar62;
          local_980 = local_1340._0_8_;
          uStack_978 = local_1340._8_8_;
          uStack_970 = local_1340._16_8_;
          uStack_968 = local_1340._24_8_;
          auVar37._16_8_ = uVar61;
          auVar37._0_16_ = auVar30;
          auVar37._24_8_ = uVar62;
          auVar34 = vpcmpgtw_avx2(auVar37,local_1340);
          local_1440 = auVar39._0_8_;
          uStack_1438 = auVar39._8_8_;
          uStack_1430 = auVar39._16_8_;
          uStack_1428 = auVar39._24_8_;
          local_8a0 = local_1340._0_8_;
          uStack_898 = local_1340._8_8_;
          uStack_890 = local_1340._16_8_;
          uStack_888 = local_1340._24_8_;
          local_8c0 = local_1440;
          uStack_8b8 = uStack_1438;
          uStack_8b0 = uStack_1430;
          uStack_8a8 = uStack_1428;
          auVar33 = vpcmpeqw_avx2(local_1340,auVar39);
          local_760 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeb50),0xe);
          local_780 = vpsrldq_avx2(_local_14c0,2);
          auVar37 = vpor_avx2(local_760,local_780);
          _local_14c0 = auVar37._0_30_;
          uStack_14a8._6_2_ = local_1198[-1];
          local_7a0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeb30),0xe);
          local_7c0 = vpsrldq_avx2(_local_14e0,2);
          auVar37 = vpor_avx2(local_7a0,local_7c0);
          local_14e0._0_8_ = auVar37._0_8_;
          if ((int)matrix == 0) {
            local_1a44 = -((short)local_11ac * (short)local_114c) - (short)local_1148;
          }
          else {
            local_1a44 = 0;
          }
          auVar67._2_2_ = local_1a44;
          auVar67._0_2_ = local_1a44;
          auVar67._4_2_ = local_1a44;
          auVar67._6_2_ = local_1a44;
          auVar67._8_2_ = local_1a44;
          auVar67._10_2_ = local_1a44;
          auVar67._12_2_ = local_1a44;
          auVar67._14_2_ = local_1a44;
          auVar67._16_2_ = local_1a44;
          auVar67._18_2_ = local_1a44;
          auVar67._20_2_ = local_1a44;
          auVar67._22_2_ = local_1a44;
          auVar67._24_2_ = local_1a44;
          auVar67._26_2_ = local_1a44;
          auVar67._28_2_ = local_1a44;
          auVar67._30_2_ = local_1a44;
          auVar67 = vpblendw_avx2(auVar37,auVar67,0x80);
          auVar37 = vpblendd_avx2(auVar37,auVar67,0xf0);
          local_1198[-1] =
               -(((short)local_11ac + (short)local_1150) * (short)local_114c) - (short)local_1148;
          local_11b0 = 0;
          array = (int *)local_14e0._0_8_;
          _local_14e0 = auVar37;
          while( true ) {
            auVar37 = _local_14c0;
            if ((int)(local_1144 + local_1154) <= (int)local_11b0) break;
            local_560 = local_14c0._0_8_;
            uStack_548 = uStack_14a8;
            local_7e0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeb30),0xe);
            local_800 = vpsrldq_avx2(_local_14e0,2);
            auVar67 = vpor_avx2(local_7e0,local_800);
            _local_14c0 = auVar67._0_30_;
            uStack_14a8._6_2_ = local_1198[(int)local_11b0];
            auVar49 = _local_14c0;
            local_820 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffeaf0),0xe);
            local_840 = vpsrldq_avx2(_local_1520,2);
            auVar38 = vpor_avx2(local_820,local_840);
            _local_1520 = auVar38._0_30_;
            uStack_1508._6_2_ = local_11a0[(int)local_11b0];
            auVar36 = _local_1520;
            local_14c0._0_8_ = auVar67._0_8_;
            local_14c0._8_8_ = auVar67._8_8_;
            local_14c0._16_8_ = auVar67._16_8_;
            uStack_14a8 = auVar49._24_8_;
            local_ba0 = local_14c0._0_8_;
            uStack_b98 = local_14c0._8_8_;
            uStack_b90 = local_14c0._16_8_;
            uStack_b88 = uStack_14a8;
            local_bc0 = local_1280;
            uStack_bb8 = uStack_1278;
            uStack_bb0 = uStack_1270;
            uStack_ba8 = uStack_1268;
            auVar48._24_8_ = uStack_14a8;
            auVar48._0_24_ = auVar67._0_24_;
            auVar47._8_8_ = uStack_1278;
            auVar47._0_8_ = local_1280;
            auVar47._16_8_ = uStack_1270;
            auVar47._24_8_ = uStack_1268;
            local_620 = vpsubsw_avx2(auVar48,auVar47);
            local_1520._0_8_ = auVar38._0_8_;
            local_1520._8_8_ = auVar38._8_8_;
            local_1520._16_8_ = auVar38._16_8_;
            uStack_1508 = auVar36._24_8_;
            local_be0 = local_1520._0_8_;
            uStack_bd8 = local_1520._8_8_;
            uStack_bd0 = local_1520._16_8_;
            uStack_bc8 = uStack_1508;
            local_c00 = local_12a0;
            uStack_bf8 = uStack_1298;
            uStack_bf0 = uStack_1290;
            uStack_be8 = uStack_1288;
            auVar46._24_8_ = uStack_1508;
            auVar46._0_24_ = auVar38._0_24_;
            auVar45._8_8_ = uStack_1298;
            auVar45._0_8_ = local_12a0;
            auVar45._16_8_ = uStack_1290;
            auVar45._24_8_ = uStack_1288;
            local_640 = vpsubsw_avx2(auVar46,auVar45);
            auVar67 = vpmaxsw_avx2(local_620,local_640);
            local_c20 = local_14e0._0_8_;
            uStack_c18 = local_14e0._8_8_;
            uStack_c10 = local_14e0._16_8_;
            uStack_c08 = uStack_14c8;
            local_c40 = local_1280;
            uStack_c38 = uStack_1278;
            uStack_c30 = uStack_1270;
            uStack_c28 = uStack_1268;
            auVar44._8_8_ = uStack_1278;
            auVar44._0_8_ = local_1280;
            auVar44._16_8_ = uStack_1270;
            auVar44._24_8_ = uStack_1268;
            local_660 = vpsubsw_avx2(_local_14e0,auVar44);
            local_c60 = local_1500._0_8_;
            uStack_c58 = local_1500._8_8_;
            uStack_c50 = local_1500._16_8_;
            uStack_c48 = local_1500._24_8_;
            local_c80 = local_12a0;
            uStack_c78 = uStack_1298;
            uStack_c70 = uStack_1290;
            uStack_c68 = uStack_1288;
            auVar35._8_8_ = uStack_1298;
            auVar35._0_8_ = local_12a0;
            auVar35._16_8_ = uStack_1290;
            auVar35._24_8_ = uStack_1288;
            local_680 = vpsubsw_avx2(local_1500,auVar35);
            auVar38 = vpmaxsw_avx2(local_660,local_680);
            local_d82 = *(ushort *)
                         (lVar16 + (long)(iVar2 * local_189c) * 4 +
                         (long)local_1190[(int)local_11b0] * 4);
            local_d84 = *(ushort *)
                         (lVar17 + (long)(iVar3 * local_18b4) * 4 +
                         (long)local_1190[(int)(local_11b0 - 1)] * 4);
            local_d86 = *(ushort *)
                         (lVar18 + (long)(iVar4 * local_18cc) * 4 +
                         (long)local_1190[(int)(local_11b0 - 2)] * 4);
            local_d88 = *(ushort *)
                         (lVar19 + (long)(iVar5 * local_18e4) * 4 +
                         (long)local_1190[(int)(local_11b0 - 3)] * 4);
            local_d8a = *(ushort *)
                         (lVar20 + (long)(iVar6 * local_18fc) * 4 +
                         (long)local_1190[(int)(local_11b0 - 4)] * 4);
            local_d8c = *(ushort *)
                         (lVar21 + (long)(iVar7 * local_1914) * 4 +
                         (long)local_1190[(int)(local_11b0 - 5)] * 4);
            local_d8e = *(ushort *)
                         (lVar22 + (long)(iVar8 * local_192c) * 4 +
                         (long)local_1190[(int)(local_11b0 - 6)] * 4);
            local_d90 = *(ushort *)
                         (lVar23 + (long)(iVar9 * local_1944) * 4 +
                         (long)local_1190[(int)(local_11b0 - 7)] * 4);
            local_d92 = *(ushort *)
                         (lVar24 + (long)(iVar10 * local_195c) * 4 +
                         (long)local_1190[(int)(local_11b0 - 8)] * 4);
            local_d94 = *(ushort *)
                         (lVar25 + (long)(iVar11 * local_1974) * 4 +
                         (long)local_1190[(int)(local_11b0 - 9)] * 4);
            local_d96 = *(ushort *)
                         (lVar26 + (long)(iVar12 * local_198c) * 4 +
                         (long)local_1190[(int)(local_11b0 - 10)] * 4);
            local_d98 = *(ushort *)
                         (lVar27 + (long)(iVar13 * local_19a4) * 4 +
                         (long)local_1190[(int)(local_11b0 - 0xb)] * 4);
            local_d9a = *(ushort *)
                         (lVar28 + (long)(iVar14 * local_19bc) * 4 +
                         (long)local_1190[(int)(local_11b0 - 0xc)] * 4);
            local_d9c = *(ushort *)
                         (lVar29 + (long)(iVar15 * local_19d4) * 4 +
                         (long)local_1190[(int)(local_11b0 - 0xd)] * 4);
            local_d9e = *(ushort *)(lVar65 + (long)local_1190[(int)(local_11b0 - 0xe)] * 4);
            local_da0 = *(ushort *)(lVar1 + (long)local_1190[(int)(local_11b0 - 0xf)] * 4);
            auVar31 = vpinsrw_avx(ZEXT216(local_da0),(uint)local_d9e,1);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d9c,2);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d9a,3);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d98,4);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d96,5);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d94,6);
            local_dc0 = vpinsrw_avx(auVar31,(uint)local_d92,7);
            auVar31 = vpinsrw_avx(ZEXT216(local_d90),(uint)local_d8e,1);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d8c,2);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d8a,3);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d88,4);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d86,5);
            auVar31 = vpinsrw_avx(auVar31,(uint)local_d84,6);
            auStack_db0 = vpinsrw_avx(auVar31,(uint)local_d82,7);
            uStack_1638 = auVar37._8_8_;
            uStack_1630 = auVar37._16_8_;
            uStack_558 = uStack_1638;
            uStack_550 = uStack_1630;
            local_580 = local_dc0._0_8_;
            uStack_578 = local_dc0._8_8_;
            uStack_570 = auStack_db0._0_8_;
            uStack_568 = auStack_db0._8_8_;
            auVar55._16_8_ = auStack_db0._0_8_;
            auVar55._0_16_ = local_dc0;
            auVar55._24_8_ = auStack_db0._8_8_;
            auVar37 = vpaddsw_avx2(auVar37,auVar55);
            local_1640 = auVar37._0_8_;
            uStack_1638 = auVar37._8_8_;
            uStack_1630 = auVar37._16_8_;
            uStack_1628 = auVar37._24_8_;
            local_1500._0_8_ = auVar38._0_8_;
            local_1500._8_8_ = auVar38._8_8_;
            local_1500._16_8_ = auVar38._16_8_;
            local_1500._24_8_ = auVar38._24_8_;
            local_6a0 = local_1640;
            uStack_698 = uStack_1638;
            uStack_690 = uStack_1630;
            uStack_688 = uStack_1628;
            local_6c0 = local_1500._0_8_;
            uStack_6b8 = local_1500._8_8_;
            uStack_6b0 = local_1500._16_8_;
            uStack_6a8 = local_1500._24_8_;
            auVar37 = vpmaxsw_avx2(auVar37,auVar38);
            local_14e0._0_8_ = auVar37._0_8_;
            local_14e0._8_8_ = auVar37._8_8_;
            local_14e0._16_8_ = auVar37._16_8_;
            uStack_14c8 = auVar37._24_8_;
            local_1520._0_8_ = auVar67._0_8_;
            local_1520._8_8_ = auVar67._8_8_;
            local_1520._16_8_ = auVar67._16_8_;
            uStack_1508 = auVar67._24_8_;
            local_6e0 = local_14e0._0_8_;
            uStack_6d8 = local_14e0._8_8_;
            uStack_6d0 = local_14e0._16_8_;
            uStack_6c8 = uStack_14c8;
            local_700 = local_1520._0_8_;
            uStack_6f8 = local_1520._8_8_;
            uStack_6f0 = local_1520._16_8_;
            uStack_6e8 = uStack_1508;
            auVar36 = vpmaxsw_avx2(auVar37,auVar67);
            local_8e0 = local_1540._0_8_;
            uStack_8d8 = local_1540._8_8_;
            uStack_8d0 = local_1540._16_8_;
            uStack_8c8 = local_1540._24_8_;
            local_900 = local_1320;
            uStack_8f8 = uStack_1318;
            uStack_8f0 = uStack_1310;
            uStack_8e8 = uStack_1308;
            auVar53._8_8_ = uStack_1318;
            auVar53._0_8_ = local_1320;
            auVar53._16_8_ = uStack_1310;
            auVar53._24_8_ = uStack_1308;
            auVar37 = vpcmpeqw_avx2(local_1540,auVar53);
            local_14e0._0_8_ = auVar36._0_8_;
            local_14e0._8_8_ = auVar36._8_8_;
            local_14e0._16_8_ = auVar36._16_8_;
            uStack_14c8 = auVar36._24_8_;
            local_1660 = auVar37._0_8_;
            uStack_1658 = auVar37._8_8_;
            uStack_1650 = auVar37._16_8_;
            uStack_1648 = auVar37._24_8_;
            local_260 = local_14e0._0_8_;
            uStack_258 = local_14e0._8_8_;
            uStack_250 = local_14e0._16_8_;
            uStack_248 = uStack_14c8;
            local_280 = local_14a0._0_8_;
            uStack_278 = local_14a0._8_8_;
            uStack_270 = local_14a0._16_8_;
            uStack_268 = local_14a0._24_8_;
            local_2a0 = local_1660;
            uStack_298 = uStack_1658;
            uStack_290 = uStack_1650;
            uStack_288 = uStack_1648;
            _local_14e0 = vpblendvb_avx2(auVar36,local_14a0,auVar37);
            local_2c0 = local_1520._0_8_;
            uStack_2b8 = local_1520._8_8_;
            uStack_2b0 = local_1520._16_8_;
            uStack_2a8 = uStack_1508;
            local_2e0 = local_1260;
            uStack_2d8 = uStack_1258;
            uStack_2d0 = uStack_1250;
            uStack_2c8 = uStack_1248;
            local_300 = local_1660;
            uStack_2f8 = uStack_1658;
            uStack_2f0 = uStack_1650;
            uStack_2e8 = uStack_1648;
            auVar57._8_8_ = uStack_1258;
            auVar57._0_8_ = local_1260;
            auVar57._16_8_ = uStack_1250;
            auVar57._24_8_ = uStack_1248;
            _local_1520 = vpblendvb_avx2(auVar67,auVar57,auVar37);
            local_320 = local_1500._0_8_;
            uStack_318 = local_1500._8_8_;
            uStack_310 = local_1500._16_8_;
            uStack_308 = local_1500._24_8_;
            local_340 = local_1260;
            uStack_338 = uStack_1258;
            uStack_330 = uStack_1250;
            uStack_328 = uStack_1248;
            local_360 = local_1660;
            uStack_358 = uStack_1658;
            uStack_350 = uStack_1650;
            uStack_348 = uStack_1648;
            auVar56._8_8_ = uStack_1258;
            auVar56._0_8_ = local_1260;
            auVar56._16_8_ = uStack_1250;
            auVar56._24_8_ = uStack_1248;
            local_1500 = vpblendvb_avx2(auVar38,auVar56,auVar37);
            uVar58 = local_14e0._0_8_;
            if (local_1154 < (int)local_11b0) {
              local_220 = local_1220._0_8_;
              uStack_218 = local_1220._8_8_;
              uStack_210 = local_1220._16_8_;
              uStack_208 = local_1220._24_8_;
              local_240 = local_14e0._0_8_;
              uStack_238 = local_14e0._8_8_;
              uStack_230 = local_14e0._16_8_;
              uStack_228 = uStack_14c8;
              local_1220 = vpminsw_avx2(local_1220,_local_14e0);
              local_720 = local_1240._0_8_;
              uStack_718 = local_1240._8_8_;
              uStack_710 = local_1240._16_8_;
              uStack_708 = local_1240._24_8_;
              local_740 = local_14e0._0_8_;
              uStack_738 = local_14e0._8_8_;
              uStack_730 = local_14e0._16_8_;
              uStack_728 = uStack_14c8;
              local_1240 = vpmaxsw_avx2(local_1240,_local_14e0);
            }
            vWH_00[1]._0_4_ = in_stack_ffffffffffffe5a0;
            vWH_00[0] = (longlong)local_1190;
            vWH_00[1]._4_4_ = local_11b0;
            vWH_00[2] = lVar1;
            vWH_00[3]._0_4_ = in_stack_ffffffffffffe5b0;
            vWH_00[3]._4_2_ = local_d9e;
            vWH_00[3]._6_2_ = local_d82;
            arr_store_si256(array,vWH_00,(int32_t)((ulong)lVar65 >> 0x20),(int32_t)lVar65,
                            in_stack_ffffffffffffe58c,in_stack_ffffffffffffe588);
            local_1198[(int)(local_11b0 - 0xf)] = local_14e0._0_2_;
            local_11a0[(int)(local_11b0 - 0xf)] = local_1520._0_2_;
            local_920 = local_1540._0_8_;
            uStack_918 = local_1540._8_8_;
            uStack_910 = local_1540._16_8_;
            uStack_908 = local_1540._24_8_;
            local_1480 = auVar40._0_8_;
            local_940 = local_1480;
            uStack_1478 = auVar40._8_8_;
            uStack_938 = uStack_1478;
            uStack_1470 = auVar40._16_8_;
            uStack_930 = uStack_1470;
            uStack_1468 = auVar40._24_8_;
            uStack_928 = uStack_1468;
            auVar38 = vpcmpeqw_avx2(local_1540,auVar40);
            local_9a0 = local_1540._0_8_;
            uStack_998 = local_1540._8_8_;
            uStack_990 = local_1540._16_8_;
            uStack_988 = local_1540._24_8_;
            local_9c0 = local_1320;
            uStack_9b8 = uStack_1318;
            uStack_9b0 = uStack_1310;
            uStack_9a8 = uStack_1308;
            auVar52._8_8_ = uStack_1318;
            auVar52._0_8_ = local_1320;
            auVar52._16_8_ = uStack_1310;
            auVar52._24_8_ = uStack_1308;
            auVar67 = vpcmpgtw_avx2(local_1540,auVar52);
            uStack_9d0 = uVar63;
            uStack_9c8 = uVar64;
            local_a00 = local_1540._0_8_;
            uStack_9f8 = local_1540._8_8_;
            uStack_9f0 = local_1540._16_8_;
            uStack_9e8 = local_1540._24_8_;
            auVar51._16_8_ = uVar63;
            auVar51._0_16_ = auVar66._0_16_;
            auVar51._24_8_ = uVar64;
            auVar36 = vpcmpgtw_avx2(auVar51,local_1540);
            local_15e0 = auVar34._0_8_;
            local_a0 = local_15e0;
            uStack_15d8 = auVar34._8_8_;
            uStack_98 = uStack_15d8;
            uStack_15d0 = auVar34._16_8_;
            uStack_90 = uStack_15d0;
            uStack_15c8 = auVar34._24_8_;
            uStack_88 = uStack_15c8;
            local_1680 = auVar38._0_8_;
            local_c0 = local_1680;
            uStack_1678 = auVar38._8_8_;
            uStack_b8 = uStack_1678;
            uStack_1670 = auVar38._16_8_;
            uStack_b0 = uStack_1670;
            uStack_1668 = auVar38._24_8_;
            uStack_a8 = uStack_1668;
            auVar37 = vpand_avx2(auVar34,auVar38);
            local_1600 = auVar33._0_8_;
            local_120 = local_1600;
            uStack_15f8 = auVar33._8_8_;
            uStack_118 = uStack_15f8;
            uStack_15f0 = auVar33._16_8_;
            uStack_110 = uStack_15f0;
            uStack_15e8 = auVar33._24_8_;
            uStack_108 = uStack_15e8;
            local_16a0 = auVar67._0_8_;
            local_e0 = local_16a0;
            uStack_1698 = auVar67._8_8_;
            uStack_d8 = uStack_1698;
            uStack_1690 = auVar67._16_8_;
            uStack_d0 = uStack_1690;
            uStack_1688 = auVar67._24_8_;
            uStack_c8 = uStack_1688;
            local_16c0 = auVar36._0_8_;
            local_100 = local_16c0;
            uStack_16b8 = auVar36._8_8_;
            uStack_f8 = uStack_16b8;
            uStack_16b0 = auVar36._16_8_;
            uStack_f0 = uStack_16b0;
            uStack_16a8 = auVar36._24_8_;
            uStack_e8 = uStack_16a8;
            local_140 = vpand_avx2(auVar67,auVar36);
            auVar67 = vpand_avx2(auVar33,local_140);
            local_a20 = uVar58;
            uStack_a18 = local_14e0._8_8_;
            uStack_a10 = local_14e0._16_8_;
            uStack_a08 = uStack_14c8;
            local_a40 = local_1380._0_8_;
            uStack_a38 = local_1380._8_8_;
            uStack_a30 = local_1380._16_8_;
            uStack_a28 = local_1380._24_8_;
            auVar36 = vpcmpgtw_avx2(_local_14e0,local_1380);
            local_a60 = uVar58;
            uStack_a58 = local_14e0._8_8_;
            uStack_a50 = local_14e0._16_8_;
            uStack_a48 = uStack_14c8;
            local_a80 = local_13a0._0_8_;
            uStack_a78 = local_13a0._8_8_;
            uStack_a70 = local_13a0._16_8_;
            uStack_a68 = local_13a0._24_8_;
            auVar35 = vpcmpgtw_avx2(_local_14e0,local_13a0);
            local_160 = local_1600;
            uStack_158 = uStack_15f8;
            uStack_150 = uStack_15f0;
            uStack_148 = uStack_15e8;
            local_180 = local_1680;
            uStack_178 = uStack_1678;
            uStack_170 = uStack_1670;
            uStack_168 = uStack_1668;
            auVar38 = vpand_avx2(auVar33,auVar38);
            local_1720 = auVar36._0_8_;
            local_1a0 = local_1720;
            uStack_1718 = auVar36._8_8_;
            uStack_198 = uStack_1718;
            uStack_1710 = auVar36._16_8_;
            uStack_190 = uStack_1710;
            uStack_1708 = auVar36._24_8_;
            uStack_188 = uStack_1708;
            local_1700 = auVar67._0_8_;
            local_1c0 = local_1700;
            uStack_16f8 = auVar67._8_8_;
            uStack_1b8 = uStack_16f8;
            uStack_16f0 = auVar67._16_8_;
            uStack_1b0 = uStack_16f0;
            uStack_16e8 = auVar67._24_8_;
            uStack_1a8 = uStack_16e8;
            auVar67 = vpand_avx2(auVar36,auVar67);
            local_1740 = auVar35._0_8_;
            local_1e0 = local_1740;
            uStack_1738 = auVar35._8_8_;
            uStack_1d8 = uStack_1738;
            uStack_1730 = auVar35._16_8_;
            uStack_1d0 = uStack_1730;
            uStack_1728 = auVar35._24_8_;
            uStack_1c8 = uStack_1728;
            local_16e0 = auVar37._0_8_;
            local_200 = local_16e0;
            uStack_16d8 = auVar37._8_8_;
            uStack_1f8 = uStack_16d8;
            uStack_16d0 = auVar37._16_8_;
            uStack_1f0 = uStack_16d0;
            uStack_16c8 = auVar37._24_8_;
            uStack_1e8 = uStack_16c8;
            auVar37 = vpand_avx2(auVar35,auVar37);
            local_380 = local_1380._0_8_;
            uStack_378 = local_1380._8_8_;
            uStack_370 = local_1380._16_8_;
            uStack_368 = local_1380._24_8_;
            local_3a0 = uVar58;
            uStack_398 = local_14e0._8_8_;
            uStack_390 = local_14e0._16_8_;
            uStack_388 = uStack_14c8;
            local_1780 = auVar67._0_8_;
            local_3c0 = local_1780;
            uStack_1778 = auVar67._8_8_;
            uStack_3b8 = uStack_1778;
            uStack_1770 = auVar67._16_8_;
            uStack_3b0 = uStack_1770;
            uStack_1768 = auVar67._24_8_;
            uStack_3a8 = uStack_1768;
            local_1380 = vpblendvb_avx2(local_1380,_local_14e0,auVar67);
            local_3e0 = local_13a0._0_8_;
            uStack_3d8 = local_13a0._8_8_;
            uStack_3d0 = local_13a0._16_8_;
            uStack_3c8 = local_13a0._24_8_;
            local_400 = uVar58;
            uStack_3f8 = local_14e0._8_8_;
            uStack_3f0 = local_14e0._16_8_;
            uStack_3e8 = uStack_14c8;
            local_17a0 = auVar37._0_8_;
            local_420 = local_17a0;
            uStack_1798 = auVar37._8_8_;
            uStack_418 = uStack_1798;
            uStack_1790 = auVar37._16_8_;
            uStack_410 = uStack_1790;
            uStack_1788 = auVar37._24_8_;
            uStack_408 = uStack_1788;
            local_13a0 = vpblendvb_avx2(local_13a0,_local_14e0,auVar37);
            local_440 = local_13c0._0_8_;
            uStack_438 = local_13c0._8_8_;
            uStack_430 = local_13c0._16_8_;
            uStack_428 = local_13c0._24_8_;
            local_460 = uVar58;
            uStack_458 = local_14e0._8_8_;
            uStack_450 = local_14e0._16_8_;
            uStack_448 = uStack_14c8;
            local_1760 = auVar38._0_8_;
            local_480 = local_1760;
            uStack_1758 = auVar38._8_8_;
            uStack_478 = uStack_1758;
            uStack_1750 = auVar38._16_8_;
            uStack_470 = uStack_1750;
            uStack_1748 = auVar38._24_8_;
            uStack_468 = uStack_1748;
            local_13c0 = vpblendvb_avx2(local_13c0,_local_14e0,auVar38);
            local_4a0 = local_13e0._0_8_;
            uStack_498 = local_13e0._8_8_;
            uStack_490 = local_13e0._16_8_;
            uStack_488 = local_13e0._24_8_;
            local_4c0 = local_1340._0_8_;
            uStack_4b8 = local_1340._8_8_;
            uStack_4b0 = local_1340._16_8_;
            uStack_4a8 = local_1340._24_8_;
            local_4e0 = local_17a0;
            uStack_4d8 = uStack_1798;
            uStack_4d0 = uStack_1790;
            uStack_4c8 = uStack_1788;
            local_13e0 = vpblendvb_avx2(local_13e0,local_1340,auVar37);
            local_500 = local_1400._0_8_;
            uStack_4f8 = local_1400._8_8_;
            uStack_4f0 = local_1400._16_8_;
            uStack_4e8 = local_1400._24_8_;
            local_520 = local_1540._0_8_;
            uStack_518 = local_1540._8_8_;
            uStack_510 = local_1540._16_8_;
            uStack_508 = local_1540._24_8_;
            local_540 = local_1780;
            uStack_538 = uStack_1778;
            uStack_530 = uStack_1770;
            uStack_528 = uStack_1768;
            local_1400 = vpblendvb_avx2(local_1400,local_1540,auVar67);
            local_5a0 = local_1540._0_8_;
            uStack_598 = local_1540._8_8_;
            uStack_590 = local_1540._16_8_;
            uStack_588 = local_1540._24_8_;
            local_5c0 = local_12c0;
            uStack_5b8 = uStack_12b8;
            uStack_5b0 = uStack_12b0;
            uStack_5a8 = uStack_12a8;
            auVar54._8_8_ = uStack_12b8;
            auVar54._0_8_ = local_12c0;
            auVar54._16_8_ = uStack_12b0;
            auVar54._24_8_ = uStack_12a8;
            local_1540 = vpaddsw_avx2(local_1540,auVar54);
            local_11b0 = local_11b0 + 1;
            _local_14c0 = auVar49;
            local_9e0 = auVar66._0_16_;
          }
          local_5e0 = local_1340._0_8_;
          uStack_5d8 = local_1340._8_8_;
          uStack_5d0 = local_1340._16_8_;
          uStack_5c8 = local_1340._24_8_;
          uStack_5f0 = auStack_12d0._0_8_;
          uStack_5e8 = auStack_12d0._8_8_;
          auVar36._16_8_ = auStack_12d0._0_8_;
          auVar36._0_16_ = local_12e0;
          auVar36._24_8_ = auStack_12d0._8_8_;
          local_1340 = vpaddsw_avx2(local_1340,auVar36);
          local_ca0 = local_14a0._0_8_;
          uStack_c98 = local_14a0._8_8_;
          uStack_c90 = local_14a0._16_8_;
          uStack_c88 = local_14a0._24_8_;
          uStack_cb0 = auStack_12f0._0_8_;
          uStack_ca8 = auStack_12f0._8_8_;
          auVar38._16_8_ = auStack_12f0._0_8_;
          auVar38._0_16_ = local_1300;
          auVar38._24_8_ = auStack_12f0._8_8_;
          local_14a0 = vpsubsw_avx2(local_14a0,auVar38);
          local_600 = local_12e0;
          local_cc0 = local_1300;
        }
        local_17a2 = local_11ba;
        local_17a4 = local_11ba;
        local_17a6 = local_11ba;
        local_17b0 = (ushort *)local_1380;
        local_17b8 = (ushort *)local_13a0;
        local_17c0 = (ushort *)local_13c0;
        local_17c8 = (short *)local_13e0;
        local_17d0 = (short *)local_1400;
        for (local_17d4 = 0; local_17d4 < local_1150; local_17d4 = local_17d4 + 1) {
          if (((short)local_17a4 < (short)*local_17b8) ||
             ((*local_17b8 == local_17a4 && (*local_17c8 < local_11b4)))) {
            local_17a4 = *local_17b8;
            local_11b4 = (int)*local_17c8;
          }
          if ((short)local_17a2 < (short)*local_17b0) {
            local_17a2 = *local_17b0;
            local_11b8 = (int)*local_17d0;
          }
          if ((short)local_17a6 < (short)*local_17c0) {
            local_17a6 = *local_17c0;
          }
          local_17b0 = local_17b0 + 1;
          local_17b8 = local_17b8 + 1;
          local_17c0 = local_17c0 + 1;
          local_17c8 = local_17c8 + 1;
          local_17d0 = local_17d0 + 1;
        }
        if ((s1_beg == 0) || (s2_beg == 0)) {
          if (s1_beg == 0) {
            if (s2_beg == 0) {
              local_11be = local_17a6;
              local_11b8 = local_1144 - 1;
            }
            else {
              local_11be = local_17a2;
            }
            local_11b4 = local_115c - 1;
          }
          else {
            local_11be = local_17a4;
            local_11b8 = local_1144 - 1;
          }
        }
        else if (((short)local_17a2 < (short)local_17a4) ||
                ((local_17a4 == local_17a2 && (local_11b8 == local_1144 - 1)))) {
          local_11be = local_17a4;
          local_11b8 = local_1144 - 1;
        }
        else {
          local_11be = local_17a2;
          local_11b4 = local_115c - 1;
        }
        local_aa0 = local_11e0;
        uStack_a98 = uStack_11d8;
        uStack_a90 = uStack_11d0;
        uStack_a88 = uStack_11c8;
        local_ac0 = local_1220._0_8_;
        uStack_ab8 = local_1220._8_8_;
        uStack_ab0 = local_1220._16_8_;
        uStack_aa8 = local_1220._24_8_;
        auVar50._8_8_ = uStack_11d8;
        auVar50._0_8_ = local_11e0;
        auVar50._16_8_ = uStack_11d0;
        auVar50._24_8_ = uStack_11c8;
        local_860 = vpcmpgtw_avx2(auVar50,local_1220);
        local_ae0 = local_1240._0_8_;
        uStack_ad8 = local_1240._8_8_;
        uStack_ad0 = local_1240._16_8_;
        uStack_ac8 = local_1240._24_8_;
        local_b00 = local_1200;
        uStack_af8 = uStack_11f8;
        uStack_af0 = uStack_11f0;
        uStack_ae8 = uStack_11e8;
        auVar49._8_8_ = uStack_11f8;
        auVar49._0_8_ = local_1200;
        auVar49._16_8_ = uStack_11f0;
        auVar49._24_8_ = uStack_11e8;
        local_880 = vpcmpgtw_avx2(local_1240,auVar49);
        local_80 = vpor_avx2(local_860,local_880);
        if ((((((((((((((((((((((((((((((((local_80 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_80 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_80 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_80 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_80 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_80 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_80 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_80 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_80 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_80 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_80 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_80 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_80 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_80 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_80 >> 0x7f,0) != '\0') ||
                          (local_80 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_80 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_80 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_80 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_80 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_80 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_80 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_80 >> 0xbf,0) != '\0') ||
                  (local_80 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_80 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_80 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_80 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_80 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_80 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_80 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_80[0x1f] < '\0') {
          local_11a8->flag = local_11a8->flag | 0x40;
          local_11be = 0;
          local_11b4 = 0;
          local_11b8 = 0;
        }
        local_11a8->score = (int)(short)local_11be;
        local_11a8->end_query = local_11b4;
        local_11a8->end_ref = local_11b8;
        parasail_free(local_1188);
        parasail_free(local_1180);
        parasail_free(local_1178);
        if (*(int *)(in_stack_00000008 + 0x30) == 0) {
          parasail_free(local_1170);
        }
        local_1128 = local_11a8;
      }
    }
  }
  return local_1128;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxHRow;
    __m256i vMaxHCol;
    __m256i vLastVal;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vGapN = s1_beg ? _mm256_set1_epi16(0) : _mm256_set1_epi16(gap*N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vILimit1 = _mm256_subs_epi16(vILimit, vOne);
    vJLimit = _mm256_set1_epi16(s2Len);
    vJLimit1 = _mm256_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm256_set1_epi16(0) : _mm256_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap,
            -open-8*gap,
            -open-9*gap,
            -open-10*gap,
            -open-11*gap,
            -open-12*gap,
            -open-13*gap,
            -open-14*gap,
            -open-15*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf;
        __m256i vWH = vNegInf;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        __m256i vIeqLimit1 = _mm256_cmpeq_epi16(vI, vILimit1);
        vNH = _mm256_srli_si256_rpl(vNH, 2);
        vNH = _mm256_insert_epi16_rpl(vNH, H_pr[-1], 15);
        vWH = _mm256_srli_si256_rpl(vWH, 2);
        vWH = _mm256_insert_epi16_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 15);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m256i vJeqLimit1 = _mm256_cmpeq_epi16(vJ, vJLimit1);
                __m256i vJgtNegOne = _mm256_cmpgt_epi16(vJ, vNegOne);
                __m256i vJltLimit = _mm256_cmplt_epi16_rpl(vJ, vJLimit);
                __m256i cond_j = _mm256_and_si256(vIltLimit, vJeqLimit1);
                __m256i cond_i = _mm256_and_si256(vIeqLimit1,
                        _mm256_and_si256(vJgtNegOne, vJltLimit));
                __m256i cond_max_row = _mm256_cmpgt_epi16(vWH, vMaxHRow);
                __m256i cond_max_col = _mm256_cmpgt_epi16(vWH, vMaxHCol);
                __m256i cond_last_val = _mm256_and_si256(vIeqLimit1, vJeqLimit1);
                __m256i cond_all_row = _mm256_and_si256(cond_max_row, cond_i);
                __m256i cond_all_col = _mm256_and_si256(cond_max_col, cond_j);
                vMaxHRow = _mm256_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm256_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm256_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
        vIBoundary = _mm256_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}